

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

void secp256k1_effective_nonce(secp256k1_gej *out_nonce,secp256k1_ge *nonce_pts,secp256k1_scalar *b)

{
  secp256k1_gej tmp;
  secp256k1_gej local_98;
  
  local_98.infinity = nonce_pts[1].infinity;
  local_98.x.n[0] = nonce_pts[1].x.n[0];
  local_98.x.n[1] = nonce_pts[1].x.n[1];
  local_98.x.n[2] = nonce_pts[1].x.n[2];
  local_98.x.n[3] = nonce_pts[1].x.n[3];
  local_98.x.n[4] = nonce_pts[1].x.n[4];
  local_98.y.n[0] = nonce_pts[1].y.n[0];
  local_98.y.n[1] = nonce_pts[1].y.n[1];
  local_98.y.n[2] = nonce_pts[1].y.n[2];
  local_98.y.n[3] = nonce_pts[1].y.n[3];
  local_98.y.n[4] = nonce_pts[1].y.n[4];
  local_98.z.n[0] = 1;
  local_98.z.n[1] = 0;
  local_98.z.n[2] = 0;
  local_98.z.n[3] = 0;
  local_98.z.n[4] = 0;
  secp256k1_ecmult(out_nonce,&local_98,b,(secp256k1_scalar *)0x0);
  secp256k1_gej_add_ge_var(out_nonce,out_nonce,nonce_pts,(secp256k1_fe *)0x0);
  return;
}

Assistant:

static void secp256k1_effective_nonce(secp256k1_gej *out_nonce, const secp256k1_ge *nonce_pts, const secp256k1_scalar *b) {
    secp256k1_gej tmp;

    secp256k1_gej_set_ge(&tmp, &nonce_pts[1]);
    secp256k1_ecmult(out_nonce, &tmp, b, NULL);
    secp256k1_gej_add_ge_var(out_nonce, out_nonce, &nonce_pts[0], NULL);
}